

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void J400ToARGBRow_C(uint8_t *src_y,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)width;
  if (width < 1) {
    uVar3 = uVar2;
  }
  for (; (int)uVar3 != (int)uVar2; uVar2 = uVar2 + 1) {
    uVar1 = src_y[uVar2];
    dst_argb[uVar2 * 4] = uVar1;
    dst_argb[uVar2 * 4 + 1] = uVar1;
    dst_argb[uVar2 * 4 + 2] = uVar1;
    dst_argb[uVar2 * 4 + 3] = 0xff;
  }
  return;
}

Assistant:

void J400ToARGBRow_C(const uint8_t* src_y, uint8_t* dst_argb, int width) {
  // Copy a Y to RGB.
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t y = src_y[0];
    dst_argb[2] = dst_argb[1] = dst_argb[0] = y;
    dst_argb[3] = 255u;
    dst_argb += 4;
    ++src_y;
  }
}